

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O1

Abc_Ntk_t *
Abc_NtkFindExact(word *pTruth,int nVars,int nFunc,int nMaxDepth,int *pArrTimeProfile,int nBTLimit,
                int nStartGates,int fVerbose)

{
  char cVar1;
  byte bVar2;
  uint uVar3;
  Vec_Ptr_t *pVVar4;
  int iVar5;
  uint uVar6;
  Ses_Man_t *pSes;
  char *__ptr;
  Abc_Ntk_t *pNtk;
  char *pcVar7;
  uint *__ptr_00;
  void *pvVar8;
  Vec_Ptr_t *vNames;
  void **ppvVar9;
  Abc_Obj_t *pAVar10;
  char *pcVar11;
  Abc_Obj_t *pFanin;
  long lVar12;
  uint uVar13;
  byte *pbVar14;
  timespec ts;
  long local_50;
  
  if (6 < nVars - 2U) {
    __assert_fail("nVars >= 2 && nVars <= 8",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExact.c"
                  ,0x976,"Abc_Ntk_t *Abc_NtkFindExact(word *, int, int, int, int *, int, int, int)")
    ;
  }
  iVar5 = clock_gettime(3,(timespec *)&ts);
  if (iVar5 < 0) {
    local_50 = 1;
  }
  else {
    lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
    local_50 = ((lVar12 >> 7) - (lVar12 >> 0x3f)) +
               CONCAT35(ts.tv_sec._5_3_,
                        CONCAT23(ts.tv_sec._3_2_,
                                 CONCAT12(ts.tv_sec._2_1_,CONCAT11(ts.tv_sec._1_1_,(byte)ts.tv_sec))
                                )) * -1000000;
  }
  pSes = Ses_ManAlloc(pTruth,nVars,nFunc,nMaxDepth,pArrTimeProfile,0,nBTLimit,fVerbose);
  pSes->nStartGates = nStartGates;
  pSes->fSatVerbose = 0;
  pSes->fReasonVerbose = 0;
  if (fVerbose != 0) {
    Ses_ManPrintFuncs(pSes);
  }
  __ptr = Ses_ManFindMinimumSize(pSes);
  if (__ptr == (char *)0x0) {
    pNtk = (Abc_Ntk_t *)0x0;
    goto LAB_002ba29c;
  }
  pNtk = Abc_NtkAlloc(ABC_NTK_LOGIC,ABC_FUNC_SOP,1);
  pcVar7 = Extra_UtilStrsav("exact");
  pNtk->pName = pcVar7;
  iVar5 = (int)*__ptr;
  cVar1 = __ptr[2];
  __ptr_00 = (uint *)malloc(0x10);
  uVar6 = 8;
  if (6 < (cVar1 + iVar5) - 1U) {
    uVar6 = cVar1 + iVar5;
  }
  __ptr_00[1] = 0;
  *__ptr_00 = uVar6;
  if (uVar6 == 0) {
    pvVar8 = (void *)0x0;
  }
  else {
    pvVar8 = malloc((long)(int)uVar6 << 3);
  }
  *(void **)(__ptr_00 + 2) = pvVar8;
  ts.tv_sec._3_2_ = 0x30;
  vNames = Abc_NodeGetFakeNames(__ptr[1] + iVar5);
  pVVar4 = pNtk->vObjs;
  uVar6 = pVVar4->nCap;
  if (pVVar4->nSize == uVar6) {
    if ((int)uVar6 < 0x10) {
      if (pVVar4->pArray == (void **)0x0) {
        ppvVar9 = (void **)malloc(0x80);
      }
      else {
        ppvVar9 = (void **)realloc(pVVar4->pArray,0x80);
      }
      pVVar4->pArray = ppvVar9;
      iVar5 = 0x10;
    }
    else {
      iVar5 = uVar6 * 2;
      if (iVar5 <= (int)uVar6) goto LAB_002b9ef5;
      if (pVVar4->pArray == (void **)0x0) {
        ppvVar9 = (void **)malloc((ulong)uVar6 << 4);
      }
      else {
        ppvVar9 = (void **)realloc(pVVar4->pArray,(ulong)uVar6 << 4);
      }
      pVVar4->pArray = ppvVar9;
    }
    pVVar4->nCap = iVar5;
  }
LAB_002b9ef5:
  iVar5 = pVVar4->nSize;
  pVVar4->nSize = iVar5 + 1;
  pVVar4->pArray[iVar5] = (void *)0x0;
  if ('\0' < *__ptr) {
    lVar12 = 0;
    do {
      pAVar10 = Abc_NtkCreateObj(pNtk,ABC_OBJ_PI);
      if (vNames->nSize <= lVar12) goto LAB_002ba32a;
      Abc_ObjAssignName(pAVar10,(char *)vNames->pArray[lVar12],(char *)0x0);
      uVar6 = __ptr_00[1];
      uVar3 = *__ptr_00;
      if (uVar6 == uVar3) {
        if ((int)uVar3 < 0x10) {
          if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
            pvVar8 = malloc(0x80);
          }
          else {
            pvVar8 = realloc(*(void **)(__ptr_00 + 2),0x80);
          }
          uVar13 = 0x10;
        }
        else {
          uVar13 = uVar3 * 2;
          if ((int)uVar13 <= (int)uVar3) goto LAB_002b9fbd;
          if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
            pvVar8 = malloc((ulong)uVar3 << 4);
          }
          else {
            pvVar8 = realloc(*(void **)(__ptr_00 + 2),(ulong)uVar3 << 4);
          }
        }
        *(void **)(__ptr_00 + 2) = pvVar8;
        *__ptr_00 = uVar13;
      }
LAB_002b9fbd:
      __ptr_00[1] = uVar6 + 1;
      *(Abc_Obj_t **)(*(long *)(__ptr_00 + 2) + (long)(int)uVar6 * 8) = pAVar10;
      lVar12 = lVar12 + 1;
    } while (lVar12 < *__ptr);
  }
  pbVar14 = (byte *)(__ptr + 3);
  if ('\0' < __ptr[2]) {
    iVar5 = 0;
    do {
      bVar2 = *pbVar14;
      ts.tv_sec._2_1_ = bVar2 & 1 | 0x30;
      ts.tv_sec._1_1_ = bVar2 >> 1 & 1 | 0x30;
      ts.tv_sec._0_1_ = bVar2 >> 2 & 1 | 0x30;
      if (pbVar14[1] != 2) {
        __assert_fail("*p == 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExact.c"
                      ,0x700,"Abc_Ntk_t *Ses_ManExtractNtk(const char *)");
      }
      pcVar7 = Abc_SopFromTruthBin((char *)&ts);
      pAVar10 = Abc_NtkCreateObj(pNtk,ABC_OBJ_NODE);
      pcVar11 = Abc_SopRegister((Mem_Flex_t *)pNtk->pManFunc,pcVar7);
      (pAVar10->field_5).pData = pcVar11;
      uVar6 = __ptr_00[1];
      uVar3 = *__ptr_00;
      if (uVar6 == uVar3) {
        if ((int)uVar3 < 0x10) {
          if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
            pvVar8 = malloc(0x80);
          }
          else {
            pvVar8 = realloc(*(void **)(__ptr_00 + 2),0x80);
          }
          uVar13 = 0x10;
        }
        else {
          uVar13 = uVar3 * 2;
          if ((int)uVar13 <= (int)uVar3) goto LAB_002ba0da;
          if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
            pvVar8 = malloc((ulong)uVar3 << 4);
          }
          else {
            pvVar8 = realloc(*(void **)(__ptr_00 + 2),(ulong)uVar3 << 4);
          }
        }
        *(void **)(__ptr_00 + 2) = pvVar8;
        *__ptr_00 = uVar13;
      }
LAB_002ba0da:
      lVar12 = *(long *)(__ptr_00 + 2);
      __ptr_00[1] = uVar6 + 1;
      *(Abc_Obj_t **)(lVar12 + (long)(int)uVar6 * 8) = pAVar10;
      if (pcVar7 != (char *)0x0) {
        free(pcVar7);
      }
      bVar2 = pbVar14[2];
      if (((char)bVar2 < '\0') || ((int)uVar6 < (int)(char)bVar2)) goto LAB_002ba32a;
      Abc_ObjAddFanin(pAVar10,*(Abc_Obj_t **)(lVar12 + (ulong)(uint)(int)(char)bVar2 * 8));
      bVar2 = pbVar14[3];
      if (((char)bVar2 < '\0') || ((int)uVar6 < (int)(char)bVar2)) goto LAB_002ba32a;
      pbVar14 = pbVar14 + 4;
      Abc_ObjAddFanin(pAVar10,*(Abc_Obj_t **)(lVar12 + (ulong)(uint)(int)(char)bVar2 * 8));
      iVar5 = iVar5 + 1;
    } while (iVar5 < __ptr[2]);
  }
  if ('\0' < __ptr[1]) {
    iVar5 = 0;
    do {
      pAVar10 = Abc_NtkCreateObj(pNtk,ABC_OBJ_PO);
      uVar6 = *__ptr + iVar5;
      if (((int)uVar6 < 0) || (vNames->nSize <= (int)uVar6)) {
LAB_002ba32a:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      Abc_ObjAssignName(pAVar10,(char *)vNames->pArray[uVar6],(char *)0x0);
      bVar2 = *pbVar14;
      if ((char)bVar2 < '\0') {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x130,"int Abc_LitIsCompl(int)");
      }
      uVar6 = ((uint)(int)(char)bVar2 >> 1) + (int)*__ptr;
      if (((int)(char)bVar2 & 1U) == 0) {
        if (((int)uVar6 < 0) || ((int)__ptr_00[1] <= (int)uVar6)) goto LAB_002ba32a;
        pFanin = *(Abc_Obj_t **)(*(long *)(__ptr_00 + 2) + (ulong)uVar6 * 8);
      }
      else {
        if (((int)uVar6 < 0) || ((int)__ptr_00[1] <= (int)uVar6)) goto LAB_002ba32a;
        pFanin = Abc_NtkCreateNodeInv
                           (pNtk,*(Abc_Obj_t **)(*(long *)(__ptr_00 + 2) + (ulong)uVar6 * 8));
      }
      Abc_ObjAddFanin(pAVar10,pFanin);
      pbVar14 = pbVar14 + (long)*__ptr + 2;
      iVar5 = iVar5 + 1;
    } while (iVar5 < __ptr[1]);
  }
  Abc_NodeFreeNames(vNames);
  if (*(void **)(__ptr_00 + 2) != (void *)0x0) {
    free(*(void **)(__ptr_00 + 2));
    __ptr_00[2] = 0;
    __ptr_00[3] = 0;
  }
  free(__ptr_00);
  iVar5 = Abc_NtkCheck(pNtk);
  if (iVar5 == 0) {
    puts("Ses_ManExtractSolution(): Network check has failed.");
  }
  free(__ptr);
LAB_002ba29c:
  iVar5 = clock_gettime(3,(timespec *)&ts);
  if (iVar5 < 0) {
    lVar12 = -1;
  }
  else {
    lVar12 = ts.tv_nsec / 1000 +
             CONCAT35(ts.tv_sec._5_3_,
                      CONCAT23(ts.tv_sec._3_2_,
                               CONCAT12(ts.tv_sec._2_1_,CONCAT11(ts.tv_sec._1_1_,(byte)ts.tv_sec))))
             * 1000000;
  }
  pSes->timeTotal = lVar12 + local_50;
  if (fVerbose != 0) {
    Ses_ManPrintRuntime(pSes);
  }
  if (pSes->pSat != (sat_solver *)0x0) {
    sat_solver_delete(pSes->pSat);
  }
  Ses_ManCleanLight(pSes);
  return pNtk;
}

Assistant:

Abc_Ntk_t * Abc_NtkFindExact( word * pTruth, int nVars, int nFunc, int nMaxDepth, int * pArrTimeProfile, int nBTLimit, int nStartGates, int fVerbose )
{
    Ses_Man_t * pSes;
    char * pSol;
    Abc_Ntk_t * pNtk = NULL;
    abctime timeStart;

    /* some checks */
    assert( nVars >= 2 && nVars <= 8 );

    timeStart = Abc_Clock();

    pSes = Ses_ManAlloc( pTruth, nVars, nFunc, nMaxDepth, pArrTimeProfile, 0, nBTLimit, fVerbose );
    pSes->nStartGates = nStartGates;
    pSes->fReasonVerbose = 0;
    pSes->fSatVerbose = 0;
    if ( fVerbose )
        Ses_ManPrintFuncs( pSes );

    if ( ( pSol = Ses_ManFindMinimumSize( pSes ) ) != NULL )
    {
        pNtk = Ses_ManExtractNtk( pSol );
        ABC_FREE( pSol );
    }

    pSes->timeTotal = Abc_Clock() - timeStart;

    if ( fVerbose )
        Ses_ManPrintRuntime( pSes );

    /* cleanup */
    Ses_ManClean( pSes );

    return pNtk;
}